

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::BlindTxInRequest::~BlindTxInRequest(BlindTxInRequest *this)

{
  BlindTxInRequest *this_local;
  
  (this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindTxInRequest_01b4cb90;
  std::__cxx11::string::~string((string *)&this->asset_blind_factor_);
  std::__cxx11::string::~string((string *)&this->blind_factor_);
  std::__cxx11::string::~string((string *)&this->asset_);
  std::__cxx11::string::~string((string *)&this->txid_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->ignore_items);
  core::JsonClassBase<cfd::js::api::json::BlindTxInRequest>::~JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>);
  return;
}

Assistant:

virtual ~BlindTxInRequest() {
    // do nothing
  }